

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QtPrivate::QCalToolButton::paintEvent(QCalToolButton *this,QPaintEvent *e)

{
  bool bVar1;
  QPalette *pQVar2;
  long *plVar3;
  ColorGroup CVar4;
  long in_FS_OFFSET;
  QStyleOptionToolButton opt;
  QBrush local_e0 [8];
  undefined1 local_d8 [24];
  QStyleOptionToolButton local_c0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_c0,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&local_c0);
  (**(code **)(*(long *)&(this->super_QToolButton).super_QAbstractButton.super_QWidget + 0x1b8))
            (this,&local_c0);
  if ((local_c0.super_QStyleOptionComplex.super_QStyleOption.state.
       super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i.
       _1_1_ & 0x20) == 0) {
    bVar1 = QAbstractButton::isDown((QAbstractButton *)this);
    if (!bVar1) {
      local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = QWidget::palette((QWidget *)this);
      QPalette::QPalette((QPalette *)local_d8,pQVar2);
      CVar4 = (ColorGroup)(QPalette *)local_d8;
      plVar3 = (long *)QPalette::brush(CVar4,Dark);
      QBrush::QBrush(local_e0,(QColor *)(*plVar3 + 8),SolidPattern);
      QPalette::setBrush(CVar4,Mid,(QBrush *)0x8);
      QBrush::~QBrush(local_e0);
      goto LAB_003cea9c;
    }
  }
  QPalette::QPalette((QPalette *)local_d8);
LAB_003cea9c:
  QWidget::setPalette((QWidget *)this,(QPalette *)local_d8);
  QPalette::~QPalette((QPalette *)local_d8);
  QToolButton::paintEvent(&this->super_QToolButton,e);
  QFont::~QFont(&local_c0.font);
  if (&(local_c0.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_c0.icon);
  QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent *e) override
    {
        Q_UNUSED(e);

        QStyleOptionToolButton opt;
        initStyleOption(&opt);

        if (opt.state & QStyle::State_MouseOver || isDown()) {
            //act as normal button
            setPalette(QPalette());
        } else {
            //set the highlight color for button text
            QPalette toolPalette = palette();
            toolPalette.setColor(QPalette::ButtonText, toolPalette.color(QPalette::HighlightedText));
            setPalette(toolPalette);
        }

        QToolButton::paintEvent(e);
    }